

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotLineEx<ImPlot::GetterXsYs<int>>(char *label_id,GetterXsYs<int> *getter)

{
  TransformerLinLin transformer;
  ImPlotContext *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  ImU32 col_mk_fill;
  ImDrawList *DrawList;
  int i;
  int iVar4;
  ImPlotPoint p;
  ImPlotPoint local_38;
  
  bVar2 = BeginItem(label_id,0);
  if (bVar2) {
    if (GImPlot->FitThisFrame == true) {
      for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
        local_38 = GetterXsYs<int>::operator()(getter,iVar4);
        FitPoint(&local_38);
      }
    }
    pIVar1 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((1 < getter->Count) && ((pIVar1->NextItemData).RenderLine == true)) {
      IVar3 = ImGui::GetColorU32((pIVar1->NextItemData).Colors);
      iVar4 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar4]) {
      case 0:
        local_38.x._0_4_ = iVar4;
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>
                  (getter,(TransformerLinLin *)&local_38,DrawList,(pIVar1->NextItemData).LineWeight,
                   IVar3);
        break;
      case 1:
        local_38.x._0_4_ = iVar4;
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin>
                  (getter,(TransformerLogLin *)&local_38,DrawList,(pIVar1->NextItemData).LineWeight,
                   IVar3);
        break;
      case 2:
        local_38.x._0_4_ = iVar4;
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog>
                  (getter,(TransformerLinLog *)&local_38,DrawList,(pIVar1->NextItemData).LineWeight,
                   IVar3);
        break;
      case 3:
        local_38.x._0_4_ = iVar4;
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)&local_38,DrawList,(pIVar1->NextItemData).LineWeight,
                   IVar3);
      }
    }
    if ((pIVar1->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar1->NextItemData).MarkerSize);
      IVar3 = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 2);
      col_mk_fill = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 3);
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[transformer.YAxis]) {
      case 0:
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<int>>
                  (*getter,transformer,DrawList,(pIVar1->NextItemData).Marker,
                   (pIVar1->NextItemData).MarkerSize,(pIVar1->NextItemData).RenderMarkerLine,IVar3,
                   (pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
                   col_mk_fill);
        break;
      case 1:
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<int>>
                  (*getter,(TransformerLogLin)transformer.YAxis,DrawList,
                   (pIVar1->NextItemData).Marker,(pIVar1->NextItemData).MarkerSize,
                   (pIVar1->NextItemData).RenderMarkerLine,IVar3,(pIVar1->NextItemData).MarkerWeight
                   ,(pIVar1->NextItemData).RenderMarkerFill,col_mk_fill);
        break;
      case 2:
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<int>>
                  (*getter,(TransformerLinLog)transformer.YAxis,DrawList,
                   (pIVar1->NextItemData).Marker,(pIVar1->NextItemData).MarkerSize,
                   (pIVar1->NextItemData).RenderMarkerLine,IVar3,(pIVar1->NextItemData).MarkerWeight
                   ,(pIVar1->NextItemData).RenderMarkerFill,col_mk_fill);
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<int>>
                  (*getter,(TransformerLogLog)transformer.YAxis,DrawList,
                   (pIVar1->NextItemData).Marker,(pIVar1->NextItemData).MarkerSize,
                   (pIVar1->NextItemData).RenderMarkerLine,IVar3,(pIVar1->NextItemData).MarkerWeight
                   ,(pIVar1->NextItemData).RenderMarkerFill,col_mk_fill);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotLineEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineStrip(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineStrip(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineStrip(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineStrip(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}